

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::Context::Context(Context *this,int argc,char **argv)

{
  ContextState *this_00;
  String local_48;
  char **local_20;
  char **argv_local;
  Context *pCStack_10;
  int argc_local;
  Context *this_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  this_00 = (ContextState *)operator_new(0x1160);
  detail::ContextState::ContextState(this_00);
  this->p = this_00;
  parseArgs(this,argv_local._4_4_,local_20,true);
  if (argv_local._4_4_ != 0) {
    String::String(&local_48,*local_20);
    String::operator=(&(this->p->super_ContextOptions).binary_name,&local_48);
    String::~String(&local_48);
  }
  return;
}

Assistant:

Context::Context(int argc, const char* const* argv)
        : p(new detail::ContextState) {
    parseArgs(argc, argv, true);
    if(argc)
        p->binary_name = argv[0];
}